

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O1

void UpnpRemoveAllVirtualDirs(void)

{
  virtual_Dir_List *pvVar1;
  virtual_Dir_List *__ptr;
  
  if (UpnpSdkInit == 1) {
    __ptr = pVirtualDirList;
    if (pVirtualDirList != (virtualDirList *)0x0) {
      do {
        pvVar1 = __ptr->next;
        free(__ptr);
        __ptr = pvVar1;
      } while (pvVar1 != (virtual_Dir_List *)0x0);
    }
    pVirtualDirList = (virtualDirList *)0x0;
  }
  return;
}

Assistant:

void UpnpRemoveAllVirtualDirs(void)
{
	virtualDirList *pCur;
	virtualDirList *pNext;

	if (UpnpSdkInit != 1) {
		return;
	}

	pCur = pVirtualDirList;

	while (pCur != NULL) {
		pNext = pCur->next;
		free(pCur);

		pCur = pNext;
	}

	pVirtualDirList = NULL;
}